

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O3

int SDL_SetTimer(Uint32 interval,SDL12_TimerCallback callback)

{
  if (SDL_SetTimer::compat_timer != 0) {
    (*SDL20_RemoveTimer)(SDL_SetTimer::compat_timer);
    SDL_SetTimer::compat_timer = 0;
  }
  if ((callback != (SDL12_TimerCallback)0x0 && interval != 0) &&
     (SDL_SetTimer::compat_timer =
           (*SDL20_AddTimer)(((interval + 9) / 10) * 10,SetTimerCallback12,callback),
     SDL_SetTimer::compat_timer == 0)) {
    return -1;
  }
  return 0;
}

Assistant:

SDLCALL
SDL_SetTimer(Uint32 interval, SDL12_TimerCallback callback)
{
    static SDL_TimerID compat_timer;

    if (compat_timer) {
        SDL20_RemoveTimer(compat_timer);
        compat_timer = 0;
    }

    if (interval && callback) {
        interval = RoundTimerTo12Resolution(interval);
        compat_timer = SDL20_AddTimer(interval, SetTimerCallback12, (void*)callback);
        if (!compat_timer) {
            return -1;
        }
    }
    return 0;
}